

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Col_meat.hpp
# Opt level: O0

void __thiscall
arma::Col<double>::Col<arma::fill::fill_randn>
          (Col<double> *this,uword in_n_elem,fill_class<arma::fill::fill_randn> *f)

{
  fill_class<arma::fill::fill_randn> *in_RDI;
  uword in_stack_ffffffffffffffd0;
  uword in_stack_ffffffffffffffd4;
  arma_vec_indicator *in_stack_ffffffffffffffd8;
  Mat<double> *in_stack_ffffffffffffffe0;
  
  Mat<double>::Mat(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                   in_stack_ffffffffffffffd0,(uhword)((ulong)in_RDI >> 0x30));
  Mat<double>::fill<arma::fill::fill_randn>
            ((Mat<double> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
  return;
}

Assistant:

inline
Col<eT>::Col(const uword in_n_elem, const fill::fill_class<fill_type>& f)
  : Mat<eT>(arma_vec_indicator(), in_n_elem, 1, 1)
  {
  arma_debug_sigprint();
  
  (*this).fill(f);
  }